

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicXorCase::verify
          (ShaderAtomicXorCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  Precision PVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  int in_stack_00000008;
  long in_stack_00000010;
  Hex<8UL> local_1f0;
  ulong local_1e8;
  int local_1dc;
  int local_1d8;
  uint local_1d4;
  ShaderAtomicXorCase *local_1d0;
  ulong local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  PVar2 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar8 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  local_1b8 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)uVar8;
  local_1c8 = local_1b8 & 0xffffffff;
  uVar11 = 0xff;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar11 = 0xffff;
  }
  uVar7 = 0xffffffff;
  if (PVar2 != PRECISION_HIGHP) {
    uVar7 = uVar11;
  }
  if (0 < (int)local_1b8) {
    bVar16 = (this->super_ShaderAtomicOpCase).m_initialValue == 0;
    local_1b8 = local_1b8 & 0xffffffff;
    iVar10 = (int)sig;
    local_1d8 = uVar8 * iVar10;
    local_1c0 = (ulong)uVar8 - 1;
    local_1dc = uVar8 * (int)tbs;
    iVar9 = 0;
    uVar14 = (ulong)sig & 0xffffffff;
    local_1e8 = 0;
    local_1c8 = 0;
    local_1d4 = (uint)bVar16;
    do {
      iVar5 = (int)uVar14;
      lVar13 = local_1c0;
      bVar15 = bVar16;
      if (1 < (int)uVar8) {
        do {
          bVar15 = (bool)(bVar15 ^ *(int *)(siglen + (long)(int)uVar14) == 0);
          uVar14 = (ulong)(uint)((int)uVar14 + iVar10);
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      uVar11 = *(uint *)(in_stack_00000010 + (int)local_1e8 * in_stack_00000008);
      uVar3 = *(uint *)(siglen + (long)(int)(uVar8 * (int)local_1e8 * iVar10));
      uVar6 = ~uVar3;
      uVar4 = uVar6;
      if (!bVar15) {
        uVar4 = uVar3;
      }
      uVar4 = uVar4 ^ uVar11;
      local_1d0 = this;
      if ((uVar4 & uVar7) != 0) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar1,(int)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected ",0xb);
        local_1f0.value = (ulong)uVar3;
        tcu::Format::Hex<8UL>::toStream(&local_1f0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," or ",4);
        local_1f0.value = (deUint64)uVar6;
        tcu::Format::Hex<8UL>::toStream(&local_1f0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (compare mask ",0xf);
        local_1f0.value = (deUint64)uVar7;
        tcu::Format::Hex<8UL>::toStream(&local_1f0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"), got ",7);
        local_1f0.value = (ulong)uVar11;
        tcu::Format::Hex<8UL>::toStream(&local_1f0,(ostream *)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0146db84:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        uVar11 = (uint)local_1c8;
        goto LAB_0146db9b;
      }
      if (0 < (int)uVar8) {
        uVar14 = 0;
        iVar12 = iVar9;
        do {
          uVar11 = *(uint *)(tbslen + (long)iVar12);
          uVar4 = uVar11 & uVar7;
          if ((((uVar4 != 0) && (uVar4 != uVar7)) && (uVar4 != (uVar3 & uVar7))) &&
             (uVar4 != (uVar6 & uVar7))) {
            local_1b0._0_8_ =
                 ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"ERROR: at group ",0x10);
            std::ostream::operator<<(poVar1,(int)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,", invocation ",0xd);
            std::ostream::operator<<(poVar1,(int)uVar14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,": found unexpected value ",0x19);
            local_1f0.value = (ulong)uVar11;
            tcu::Format::Hex<8UL>::toStream(&local_1f0,(ostream *)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0146db84;
          }
          uVar14 = uVar14 + 1;
          iVar12 = iVar12 + (int)tbs;
        } while (uVar8 != uVar14);
      }
      local_1e8 = local_1e8 + 1;
      local_1c8 = (ulong)CONCAT31((int3)(uVar4 >> 8),local_1b8 <= local_1e8);
      uVar14 = (ulong)(uint)(iVar5 + local_1d8);
      iVar9 = iVar9 + local_1dc;
    } while (local_1e8 != local_1b8);
  }
  uVar11 = (uint)CONCAT71((int7)(local_1c8 >> 8),1);
LAB_0146db9b:
  return uVar11 & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= numBits == 32 ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			const deUint32	randomValue		= *(const deInt32*)((const deUint8*)inputs + inputStride*groupOffset);
			const deUint32	expected0		= randomValue ^ 0u;
			const deUint32	expected1		= randomValue ^ ~0u;
			int				numXorZeros		= (m_initialValue == 0) ? 1 : 0;

			for (int localNdx = 1; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				if (inputValue == 0)
					numXorZeros += 1;
			}

			const deUint32 expected = (numXorZeros%2 == 0) ? expected0 : expected1;

			if ((groupOutput & compareMask) != (expected & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expected0)
													   << " or " << tcu::toHex(expected1) << " (compare mask " << tcu::toHex(compareMask)
													   << "), got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((outputValue & compareMask) != 0 &&
					(outputValue & compareMask) != compareMask &&
					(outputValue & compareMask) != (expected0&compareMask) &&
					(outputValue & compareMask) != (expected1&compareMask))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}